

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

bool wabt::anon_unknown_0::func_uses_simd(FuncSignature *sig)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  long lVar5;
  ulong uVar6;
  
  pTVar2 = (sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)pTVar1 - (long)pTVar2;
  if (0 < (long)uVar6 >> 5) {
    pTVar4 = (pointer)((long)&pTVar2->enum_ + (uVar6 & 0xffffffffffffffe0));
    lVar5 = ((long)uVar6 >> 5) + 1;
    pTVar2 = pTVar2 + 2;
    do {
      if (pTVar2[-2].enum_ == V128) {
        pTVar2 = pTVar2 + -2;
        goto LAB_00142ca9;
      }
      if (pTVar2[-1].enum_ == V128) {
        pTVar2 = pTVar2 + -1;
        goto LAB_00142ca9;
      }
      if (pTVar2->enum_ == V128) goto LAB_00142ca9;
      if (pTVar2[1].enum_ == V128) {
        pTVar2 = pTVar2 + 1;
        goto LAB_00142ca9;
      }
      lVar5 = lVar5 + -1;
      pTVar2 = pTVar2 + 4;
    } while (1 < lVar5);
    uVar6 = (long)pTVar1 - (long)pTVar4;
    pTVar2 = pTVar4;
  }
  lVar5 = (long)uVar6 >> 3;
  if (lVar5 == 1) {
LAB_00142c8e:
    if (pTVar2->enum_ != V128) {
      pTVar2 = pTVar1;
    }
LAB_00142ca9:
    if (pTVar2 != pTVar1) {
      return true;
    }
  }
  else {
    if (lVar5 == 2) {
LAB_00142c86:
      if (pTVar2->enum_ != V128) {
        pTVar2 = pTVar2 + 1;
        goto LAB_00142c8e;
      }
      goto LAB_00142ca9;
    }
    if (lVar5 == 3) {
      if (pTVar2->enum_ != V128) {
        pTVar2 = pTVar2 + 1;
        goto LAB_00142c86;
      }
      goto LAB_00142ca9;
    }
  }
  pTVar2 = (sig->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (sig->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)pTVar1 - (long)pTVar2;
  if (0 < (long)uVar6 >> 5) {
    pTVar3 = (pointer)((long)&pTVar2->enum_ + (uVar6 & 0xffffffffffffffe0));
    lVar5 = ((long)uVar6 >> 5) + 1;
    pTVar4 = pTVar2 + 2;
    do {
      if (pTVar4[-2].enum_ == V128) {
        pTVar4 = pTVar4 + -2;
        goto LAB_00142d4b;
      }
      if (pTVar4[-1].enum_ == V128) {
        pTVar4 = pTVar4 + -1;
        goto LAB_00142d4b;
      }
      if (pTVar4->enum_ == V128) goto LAB_00142d4b;
      if (pTVar4[1].enum_ == V128) {
        pTVar4 = pTVar4 + 1;
        goto LAB_00142d4b;
      }
      lVar5 = lVar5 + -1;
      pTVar4 = pTVar4 + 4;
    } while (1 < lVar5);
    uVar6 = (long)pTVar1 - (long)pTVar3;
    pTVar2 = pTVar3;
  }
  lVar5 = (long)uVar6 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pTVar4 = pTVar1;
      if ((lVar5 != 3) || (pTVar4 = pTVar2, pTVar2->enum_ == V128)) goto LAB_00142d4b;
      pTVar2 = pTVar2 + 1;
    }
    pTVar4 = pTVar2;
    if (pTVar2->enum_ == V128) goto LAB_00142d4b;
    pTVar2 = pTVar2 + 1;
  }
  pTVar4 = pTVar2;
  if (pTVar2->enum_ != V128) {
    pTVar4 = pTVar1;
  }
LAB_00142d4b:
  return pTVar4 != pTVar1;
}

Assistant:

static bool func_uses_simd(const FuncSignature& sig) {
  return std::any_of(sig.param_types.begin(), sig.param_types.end(),
                     [](auto x) { return x == Type::V128; }) ||
         std::any_of(sig.result_types.begin(), sig.result_types.end(),
                     [](auto x) { return x == Type::V128; });
}